

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::TailoredSet::addPrefix
          (TailoredSet *this,CollationData *d,UnicodeString *pfx,UChar32 c,uint32_t ce32)

{
  ushort uVar1;
  UnicodeSet *this_00;
  ushort uVar2;
  uint32_t uVar3;
  UnicodeString *s;
  UnicodeString local_60;
  
  setPrefix(this,pfx);
  uVar3 = CollationData::getFinalCE32(d,ce32);
  if ((uVar3 & 0xcf) == 0xc9) {
    addContractions(this,c,d->contexts + (ulong)(uVar3 >> 0xd) + 2);
  }
  this_00 = this->tailored;
  UnicodeString::UnicodeString(&local_60,&this->unreversedPrefix);
  s = UnicodeString::append(&local_60,c);
  UnicodeSet::add(this_00,s);
  UnicodeString::~UnicodeString(&local_60);
  uVar1 = (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags;
  uVar2 = 2;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1 & 0x1e;
  }
  (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags = uVar2;
  return;
}

Assistant:

void
TailoredSet::addPrefix(const CollationData *d, const UnicodeString &pfx, UChar32 c, uint32_t ce32) {
    setPrefix(pfx);
    ce32 = d->getFinalCE32(ce32);
    if(Collation::isContractionCE32(ce32)) {
        const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
        addContractions(c, p + 2);
    }
    tailored->add(UnicodeString(unreversedPrefix).append(c));
    resetPrefix();
}